

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  Argument *pAVar2;
  string *input;
  string *output;
  string_view aArgumentName;
  string_view aArgumentName_00;
  string_view aArgumentName_01;
  string_view aArgumentName_02;
  string_view aArgumentName_03;
  string_view aArgumentName_04;
  string_view aArgumentName_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  any local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_file;
  ArgumentParser program;
  string local_558;
  string local_538 [32];
  string local_518 [32];
  any local_4f8;
  any local_4e8;
  string local_4d8 [32];
  any local_4b8;
  any local_4a8;
  string local_498 [32];
  any local_478;
  any local_468;
  string local_458 [32];
  ifstream inf;
  byte abStack_418 [488];
  ofstream outf;
  byte abStack_210 [480];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"cc0",(allocator<char> *)&inf);
  argparse::ArgumentParser::ArgumentParser(&program,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-s");
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,"Translate the input c0 source code into a text assembly file",
             (allocator<char> *)&inf);
  std::__cxx11::string::operator=((string *)&pAVar2->mHelp,local_458);
  local_468._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_468._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar2->mDefaultValue,&local_468);
  local_478._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_478._M_storage = (_Storage)0x1;
  argparse::Argument::implicit_value(pAVar2,&local_478);
  std::any::reset(&local_478);
  std::any::reset(&local_468);
  std::__cxx11::string::~string(local_458);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-c");
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,"Translate the input c0 source code into a binary object file",
             (allocator<char> *)&inf);
  std::__cxx11::string::operator=((string *)&pAVar2->mHelp,local_498);
  local_4a8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_4a8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar2->mDefaultValue,&local_4a8);
  local_4b8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_4b8._M_storage = (_Storage)0x1;
  argparse::Argument::implicit_value(pAVar2,&local_4b8);
  std::any::reset(&local_4b8);
  std::any::reset(&local_4a8);
  std::__cxx11::string::~string(local_498);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-h");
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,"Shows help with compiler usage",(allocator<char> *)&inf);
  std::__cxx11::string::operator=((string *)&pAVar2->mHelp,local_4d8);
  local_4e8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_4e8._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar2->mDefaultValue,&local_4e8);
  local_4f8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_4f8._M_storage = (_Storage)0x1;
  argparse::Argument::implicit_value(pAVar2,&local_4f8);
  std::any::reset(&local_4f8);
  std::any::reset(&local_4e8);
  std::__cxx11::string::~string(local_4d8);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-o");
  std::__cxx11::string::string<std::allocator<char>>((string *)&inf,"out",(allocator<char> *)&outf);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_628,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inf);
  std::any::operator=(&pAVar2->mDefaultValue,&local_628);
  pAVar2->field_0xbc = pAVar2->field_0xbc | 2;
  std::__cxx11::string::string<std::allocator<char>>
            (local_518,"specify the output file.",(allocator<char> *)&input_file);
  std::__cxx11::string::operator=((string *)&pAVar2->mHelp,local_518);
  std::__cxx11::string::~string(local_518);
  std::any::reset(&local_628);
  std::__cxx11::string::~string((string *)&inf);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&program,"input");
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,"specify the input file.",(allocator<char> *)&inf);
  std::__cxx11::string::operator=((string *)&pAVar2->mHelp,local_538);
  std::__cxx11::string::~string(local_538);
  argparse::ArgumentParser::parse_args(&program,argc,argv);
  aArgumentName._M_str = "input";
  aArgumentName._M_len = 5;
  argparse::ArgumentParser::get<std::__cxx11::string>(&input_file,&program,aArgumentName);
  aArgumentName_00._M_str = "-o";
  aArgumentName_00._M_len = 2;
  argparse::ArgumentParser::get<std::__cxx11::string>(&output_file,&program,aArgumentName_00);
  std::ifstream::ifstream(&inf);
  std::ofstream::ofstream(&outf);
  bVar1 = std::operator!=(&input_file,"-");
  if (bVar1) {
    input = (string *)&inf;
    std::ifstream::open(input,(_Ios_Openmode)&input_file);
    if ((abStack_418[*(long *)(_inf + -0x18)] & 5) == 0) goto LAB_0010566b;
    std::operator+(&local_648,"Fail to open ",&input_file);
    std::operator+(&local_668,&local_648," for reading.\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_668);
LAB_00105727:
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_648);
LAB_00105889:
    exit(2);
  }
  input = (string *)&std::cin;
LAB_0010566b:
  bVar1 = std::operator!=(&output_file,"-");
  if (bVar1) {
    aArgumentName_01._M_str = "-c";
    aArgumentName_01._M_len = 2;
    pAVar2 = argparse::ArgumentParser::operator[](&program,aArgumentName_01);
    local_668._M_dataplus._M_p._0_1_ = 1;
    argparse::Argument::operator==(pAVar2,(bool *)&local_668);
    output = (string *)&outf;
    std::ofstream::open(output,(_Ios_Openmode)&output_file);
    if ((abStack_210[*(long *)(_outf + -0x18)] & 5) != 0) {
      std::operator+(&local_648,"Fail to open ",&output_file);
      std::operator+(&local_668,&local_648," for writing.\n");
      std::operator<<((ostream *)&std::cout,(string *)&local_668);
      goto LAB_00105727;
    }
  }
  else {
    output = (string *)&std::cout;
  }
  aArgumentName_02._M_str = "-s";
  aArgumentName_02._M_len = 2;
  pAVar2 = argparse::ArgumentParser::operator[](&program,aArgumentName_02);
  local_668._M_dataplus._M_p._0_1_ = 1;
  bVar1 = argparse::Argument::operator==(pAVar2,(bool *)&local_668);
  if (bVar1) {
    aArgumentName_03._M_str = "-c";
    aArgumentName_03._M_len = 2;
    pAVar2 = argparse::ArgumentParser::operator[](&program,aArgumentName_03);
    local_648._M_dataplus._M_p._0_1_ = 1;
    bVar1 = argparse::Argument::operator==(pAVar2,(bool *)&local_648);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,
                      "You can only perform tokenization or syntactic analysis at one time.");
      goto LAB_00105889;
    }
  }
  aArgumentName_04._M_str = "-s";
  aArgumentName_04._M_len = 2;
  pAVar2 = argparse::ArgumentParser::operator[](&program,aArgumentName_04);
  local_668._M_dataplus._M_p._0_1_ = 1;
  bVar1 = argparse::Argument::operator==(pAVar2,(bool *)&local_668);
  if (bVar1) {
    assembler((istream *)input,(ostream *)output);
  }
  else {
    aArgumentName_05._M_str = "-c";
    aArgumentName_05._M_len = 2;
    pAVar2 = argparse::ArgumentParser::operator[](&program,aArgumentName_05);
    local_668._M_dataplus._M_p._0_1_ = 1;
    bVar1 = argparse::Argument::operator==(pAVar2,(bool *)&local_668);
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout,"You must choose -c or -s.");
      goto LAB_00105889;
    }
    compiler((istream *)input,(ostream *)output);
  }
  std::ofstream::~ofstream(&outf);
  std::ifstream::~ifstream(&inf);
  std::__cxx11::string::~string((string *)&output_file);
  std::__cxx11::string::~string((string *)&input_file);
  argparse::ArgumentParser::~ArgumentParser(&program);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	argparse::ArgumentParser program("cc0");

	program.add_argument("-s")
		.help("Translate the input c0 source code into a text assembly file")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-c")
		.help("Translate the input c0 source code into a binary object file")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-h")
		.help("Shows help with compiler usage")
		.default_value(false)
		.implicit_value(true);

	program.add_argument("-o")
		.default_value(std::string("out"))
		.required()
		.help("specify the output file.");

	program.add_argument("input")
		.help("specify the input file.");


	try {
		program.parse_args(argc, argv);
	}
	catch (const std::runtime_error & err) {
		std::cout << err.what() << std::endl;
		std::cout << program;
		exit(0);
	}

	auto input_file = program.get<std::string>("input");
	auto output_file = program.get<std::string>("-o");
	std::istream* input;
	std::ostream* output;
	std::ifstream inf;
	std::ofstream outf;
	if (input_file != "-") {
		inf.open(input_file, std::ios::in);
		if (!inf) {
			std::cout << "Fail to open "+ input_file+" for reading.\n";
			exit(2);
		}
		input = &inf;
	}
	else
		input = &std::cin;
	if (output_file != "-") {
		if (program["-c"] == true) {
			outf.open(output_file, std::ios::binary| std::ios::trunc);
		}
		else {
			outf.open(output_file, std::ios::out | std::ios::trunc);
		}
		if (!outf) {
			std::cout << "Fail to open " + output_file + " for writing.\n";
			exit(2);
		}
		output = &outf;
	}
	else
		output = &std::cout;

	if (program["-s"] == true && program["-c"] == true) {
		std::cout << "You can only perform tokenization or syntactic analysis at one time.";
		exit(2);
	}
	if (program["-s"] == true) {
		assembler(*input, *output);
	}
	else if (program["-c"] == true) {
		compiler(*input, *output);
	}
	else {
		std::cout << "You must choose -c or -s.";
		exit(2);
	}

	return 0;
}